

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::APFloat::APFloat(APFloat *this,fltSemantics *Semantics,StringRef S)

{
  fltSemantics *Semantics_local;
  APFloat *this_local;
  StringRef S_local;
  
  APFloat(this,Semantics);
  convertFromString(this,S,rmNearestTiesToEven);
  return;
}

Assistant:

APFloat::APFloat(const fltSemantics &Semantics, StringRef S)
    : APFloat(Semantics) {
  convertFromString(S, rmNearestTiesToEven);
}